

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool libcellml::updateUnitMultiplier(UnitsPtr *units,int direction,double *multiplier)

{
  EntityImpl *pEVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  element_type *this;
  ulong index;
  double dVar5;
  bool ok;
  int local_ec;
  double local_e8;
  ModelPtr model;
  element_type *local_d0;
  UnitsPtr refUnits;
  double branchMult;
  double exp;
  double local_a0;
  UnitsPtr importedUnits;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string ref;
  double expMult;
  ImportSourcePtr importSource;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_a0 = 0.0;
  local_ec = direction;
  bVar2 = ImportedEntity::isImport
                    (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ImportedEntity);
  this = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (bVar2) {
    bVar2 = ImportedEntity::isResolved(&this->super_ImportedEntity);
    if (!bVar2) {
      return false;
    }
    ImportedEntity::importSource((ImportedEntity *)&importSource);
    ImportSource::model((ImportSource *)&model);
    ImportedEntity::importReference_abi_cxx11_
              (&ref,&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->super_ImportedEntity);
    Model::units((Model *)&importedUnits,
                 (string *)
                 model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::~string((string *)&ref);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    updateUnitMultiplier(&importedUnits,1,&local_a0);
    *multiplier = (double)local_ec * local_a0 + *multiplier;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    if (*(size_type *)((long)&pEVar1[2].mId.field_2 + 8) ==
        pEVar1[2].mId.field_2._M_allocated_capacity) {
      return true;
    }
    ref._M_dataplus._M_p = (pointer)&ref.field_2;
    ref._M_string_length = 0;
    importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_40;
    importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ref.field_2._M_local_buf[0] = '\0';
    local_40._M_local_buf[0] = '\0';
    importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_88;
    importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88._M_local_buf[0] = '\0';
    local_d0 = (element_type *)0x0;
    for (index = 0; pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
        index < (ulong)((long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) -
                              pEVar1[2].mId.field_2._M_allocated_capacity) / 0x70);
        index = index + 1) {
      Units::unitAttributes
                (this,index,&ref,(string *)&importSource,&exp,&expMult,(string *)&importedUnits);
      local_e8 = log10(expMult);
      iVar3 = convertPrefixToInt((string *)&importSource,&ok);
      if (ok == false) goto LAB_0020e344;
      bVar2 = isStandardUnitName(&ref);
      if (!bVar2) {
        std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libcellml::Units,void>
                  ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
                   &refUnits,
                   &units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
        owningModel((ParentedEntityConstPtr *)&model);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&refUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        Model::units((Model *)&refUnits,
                     (string *)
                     model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (refUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          branchMult = 0.0;
          bVar2 = updateUnitMultiplier(&refUnits,1,&branchMult);
          if (bVar2) {
            local_e8 = branchMult * exp + local_e8;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&refUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            dVar5 = local_e8;
            goto LAB_0020e2c8;
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&refUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
LAB_0020e344:
        std::__cxx11::string::~string((string *)&importedUnits);
        std::__cxx11::string::~string((string *)&importSource);
        std::__cxx11::string::~string((string *)&ref);
        return false;
      }
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *)standardMultiplierList_abi_cxx11_,&ref);
      dVar5 = *pmVar4 * exp + local_e8;
LAB_0020e2c8:
      local_d0 = (element_type *)((double)local_d0 + (double)iVar3 + dVar5);
      this = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    *multiplier = (double)local_d0 * (double)local_ec + *multiplier;
    std::__cxx11::string::~string((string *)&importedUnits);
    std::__cxx11::string::~string((string *)&importSource);
    std::__cxx11::string::~string((string *)&ref);
  }
  return true;
}

Assistant:

bool updateUnitMultiplier(const UnitsPtr &units, int direction, double &multiplier)
{
    double localMultiplier = 0;

    if (units->isImport()) {
        if (units->isResolved()) {
            auto importSource = units->importSource();
            auto importedUnits = importSource->model()->units(units->importReference());
            updateUnitMultiplier(importedUnits, 1, localMultiplier);
            multiplier += localMultiplier * direction;
        } else {
            return false;
        }
    } else if (units->unitCount() > 0) {
        std::string ref;
        std::string pre;
        std::string id;
        double exp;
        double mult;
        double expMult;
        double standardMult = 0.0;
        double prefixMult = 0.0;
        for (size_t i = 0; i < units->unitCount(); ++i) {
            units->unitAttributes(i, ref, pre, exp, expMult, id);
            mult = std::log10(expMult);

            bool ok;
            prefixMult = convertPrefixToInt(pre, &ok);
            if (!ok) {
                return false;
            }

            if (isStandardUnitName(ref)) {
                standardMult = standardMultiplierList.at(ref);
                // Combine the information into a single local multiplier: exponent only applies to standard multiplier.
                localMultiplier += mult + standardMult * exp + prefixMult;
            } else {
                auto model = owningModel(units);
                auto refUnits = model->units(ref);
                if (refUnits == nullptr) {
                    return false;
                }
                double branchMult = 0.0;
                // Return false when we can't find a valid prefix.
                if (!updateUnitMultiplier(refUnits, 1, branchMult)) {
                    return false;
                }
                // Make the direction positive on all branches, direction is only applied at the end.
                localMultiplier += mult + branchMult * exp + prefixMult;
            }
        }
        multiplier += localMultiplier * direction;
    }

    return true;
}